

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

re2 * __thiscall re2::PrefixSuccessor_abi_cxx11_(re2 *this,StringPiece *prefix)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_59;
  int local_58;
  int index;
  allocator local_41;
  string local_40 [8];
  string limit;
  bool done;
  StringPiece *prefix_local;
  
  bVar1 = false;
  pcVar3 = StringPiece::data(prefix);
  iVar2 = StringPiece::size(prefix);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar3,(long)iVar2,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_58 = std::__cxx11::string::size();
  local_58 = local_58 + -1;
  while (!bVar1 && -1 < local_58) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar3 == -1) {
      std::__cxx11::string::erase((ulong)local_40,(long)local_58);
      local_58 = local_58 + -1;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      *pcVar3 = *pcVar3 + '\x01';
      bVar1 = true;
    }
  }
  if (bVar1) {
    std::__cxx11::string::string((string *)this,local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

string PrefixSuccessor(const StringPiece& prefix) {
  // We can increment the last character in the string and be done
  // unless that character is 255, in which case we have to erase the
  // last character and increment the previous character, unless that
  // is 255, etc. If the string is empty or consists entirely of
  // 255's, we just return the empty string.
  bool done = false;
  string limit(prefix.data(), prefix.size());
  int index = static_cast<int>(limit.size()) - 1;
  while (!done && index >= 0) {
    if ((limit[index]&255) == 255) {
      limit.erase(index);
      index--;
    } else {
      limit[index]++;
      done = true;
    }
  }
  if (!done) {
    return "";
  } else {
    return limit;
  }
}